

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O0

wchar_t zip_read_data_deflate(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  void *pvVar5;
  char *pp;
  uint64_t uVar6;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  archive *in_RDI;
  char *p;
  wchar_t r;
  void *compressed_buff;
  ssize_t bytes_avail;
  zip *zip;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  archive_read *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  long local_38;
  wchar_t local_4;
  
  lVar1 = *(long *)in_RDI[0x15].archive_format_name;
  if (*(long *)(lVar1 + 200) == 0) {
    *(undefined8 *)(lVar1 + 0xd0) = 0x40000;
    pvVar5 = malloc(*(size_t *)(lVar1 + 0xd0));
    *(void **)(lVar1 + 200) = pvVar5;
    if (*(long *)(lVar1 + 200) == 0) {
      archive_set_error(in_RDI,0xc,"No memory for ZIP decompression");
      return L'\xffffffe2';
    }
  }
  local_4 = zip_deflate_init((archive_read *)
                             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                             (zip *)in_stack_ffffffffffffffb0);
  if (local_4 == L'\0') {
    pvVar5 = __archive_read_ahead
                       (in_stack_ffffffffffffffb0,
                        CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                        (ssize_t *)0x16a4cc);
    if (((*(ushort *)(*(long *)(lVar1 + 0x90) + 0x7e) & 8) == 0) &&
       (*(long *)(lVar1 + 0x98) < local_38)) {
      local_38 = *(long *)(lVar1 + 0x98);
    }
    if (local_38 < 1) {
      archive_set_error(in_RDI,0x54,"Truncated ZIP file body");
      local_4 = L'\xffffffe2';
    }
    else {
      *(void **)(lVar1 + 0xd8) = pvVar5;
      *(undefined4 *)(lVar1 + 0xe0) = (undefined4)local_38;
      *(undefined8 *)(lVar1 + 0xe8) = 0;
      *(undefined8 *)(lVar1 + 0xf0) = *(undefined8 *)(lVar1 + 200);
      *(undefined4 *)(lVar1 + 0xf8) = *(undefined4 *)(lVar1 + 0xd0);
      *(undefined8 *)(lVar1 + 0x100) = 0;
      uVar3 = inflate(lVar1 + 0xd8,0);
      if (uVar3 == 0xfffffffc) {
        archive_set_error(in_RDI,0xc,"Out of memory for ZIP decompression");
        local_4 = L'\xffffffe2';
      }
      else {
        if (uVar3 != 0) {
          if (uVar3 != 1) {
            archive_set_error(in_RDI,-1,"ZIP decompression failed (%d)",(ulong)uVar3);
            return L'\xffffffe2';
          }
          *(undefined1 *)(lVar1 + 0xc2) = 1;
        }
        lVar2 = *(long *)(lVar1 + 0xe8);
        __archive_read_consume(in_stack_ffffffffffffffb0,CONCAT44(uVar3,in_stack_ffffffffffffffa8));
        *(long *)(lVar1 + 0x98) = *(long *)(lVar1 + 0x98) - lVar2;
        *(long *)(lVar1 + 0xa0) = lVar2 + *(long *)(lVar1 + 0xa0);
        *in_RDX = *(undefined8 *)(lVar1 + 0x100);
        *(long *)(lVar1 + 0xa8) = *(long *)(lVar1 + 0x100) + *(long *)(lVar1 + 0xa8);
        *in_RSI = *(undefined8 *)(lVar1 + 200);
        if ((*(char *)(lVar1 + 0xc2) != '\0') &&
           ((*(ushort *)(*(long *)(lVar1 + 0x90) + 0x7e) & 8) != 0)) {
          pp = (char *)__archive_read_ahead
                                 (in_stack_ffffffffffffffb0,
                                  CONCAT44(uVar3,in_stack_ffffffffffffffa8),(ssize_t *)0x16a716);
          if (pp == (char *)0x0) {
            archive_set_error(in_RDI,0x54,"Truncated ZIP end-of-file record");
            return L'\xffffffe2';
          }
          if ((((*pp == 'P') && (pp[1] == 'K')) && (pp[2] == '\a')) && (pp[3] == '\b')) {
            pp = pp + 4;
            *(undefined8 *)(lVar1 + 0x88) = 4;
          }
          if ((*(byte *)(*(long *)(lVar1 + 0x90) + 0x82) & 1) == 0) {
            uVar4 = archive_le32dec(pp);
            *(uint32_t *)(*(long *)(lVar1 + 0x90) + 0x78) = uVar4;
            uVar4 = archive_le32dec(pp + 4);
            *(ulong *)(*(long *)(lVar1 + 0x90) + 0x28) = (ulong)uVar4;
            uVar4 = archive_le32dec(pp + 8);
            *(ulong *)(*(long *)(lVar1 + 0x90) + 0x30) = (ulong)uVar4;
            *(long *)(lVar1 + 0x88) = *(long *)(lVar1 + 0x88) + 0xc;
          }
          else {
            uVar4 = archive_le32dec(pp);
            *(uint32_t *)(*(long *)(lVar1 + 0x90) + 0x78) = uVar4;
            uVar6 = archive_le64dec(pp);
            *(uint64_t *)(*(long *)(lVar1 + 0x90) + 0x28) = uVar6;
            uVar6 = archive_le64dec(pp);
            *(uint64_t *)(*(long *)(lVar1 + 0x90) + 0x30) = uVar6;
            *(long *)(lVar1 + 0x88) = *(long *)(lVar1 + 0x88) + 0x14;
          }
        }
        local_4 = L'\0';
      }
    }
  }
  return local_4;
}

Assistant:

static int
zip_read_data_deflate(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip *zip;
	ssize_t bytes_avail;
	const void *compressed_buff;
	int r;

	(void)offset; /* UNUSED */

	zip = (struct zip *)(a->format->data);

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = 256 * 1024;
		zip->uncompressed_buffer
		    = (unsigned char *)malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for ZIP decompression");
			return (ARCHIVE_FATAL);
		}
	}

	r = zip_deflate_init(a, zip);
	if (r != ARCHIVE_OK)
		return (r);

	/*
	 * Note: '1' here is a performance optimization.
	 * Recall that the decompression layer returns a count of
	 * available bytes; asking for more than that forces the
	 * decompressor to combine reads by copying data.
	 */
	compressed_buff = __archive_read_ahead(a, 1, &bytes_avail);
	if (0 == (zip->entry->zip_flags & ZIP_LENGTH_AT_END)
	    && bytes_avail > zip->entry_bytes_remaining) {
		bytes_avail = (ssize_t)zip->entry_bytes_remaining;
	}
	if (bytes_avail <= 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated ZIP file body");
		return (ARCHIVE_FATAL);
	}

	/*
	 * A bug in zlib.h: stream.next_in should be marked 'const'
	 * but isn't (the library never alters data through the
	 * next_in pointer, only reads it).  The result: this ugly
	 * cast to remove 'const'.
	 */
	zip->stream.next_in = (Bytef *)(uintptr_t)(const void *)compressed_buff;
	zip->stream.avail_in = (uInt)bytes_avail;
	zip->stream.total_in = 0;
	zip->stream.next_out = zip->uncompressed_buffer;
	zip->stream.avail_out = (uInt)zip->uncompressed_buffer_size;
	zip->stream.total_out = 0;

	r = inflate(&zip->stream, 0);
	switch (r) {
	case Z_OK:
		break;
	case Z_STREAM_END:
		zip->end_of_entry = 1;
		break;
	case Z_MEM_ERROR:
		archive_set_error(&a->archive, ENOMEM,
		    "Out of memory for ZIP decompression");
		return (ARCHIVE_FATAL);
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "ZIP decompression failed (%d)", r);
		return (ARCHIVE_FATAL);
	}

	/* Consume as much as the compressor actually used. */
	bytes_avail = zip->stream.total_in;
	__archive_read_consume(a, bytes_avail);
	zip->entry_bytes_remaining -= bytes_avail;
	zip->entry_compressed_bytes_read += bytes_avail;

	*size = zip->stream.total_out;
	zip->entry_uncompressed_bytes_read += zip->stream.total_out;
	*buff = zip->uncompressed_buffer;

	if (zip->end_of_entry && (zip->entry->zip_flags & ZIP_LENGTH_AT_END)) {
		const char *p;

		if (NULL == (p = __archive_read_ahead(a, 24, NULL))) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated ZIP end-of-file record");
			return (ARCHIVE_FATAL);
		}
		/* Consume the optional PK\007\010 marker. */
		if (p[0] == 'P' && p[1] == 'K' &&
		    p[2] == '\007' && p[3] == '\010') {
			p += 4;
			zip->unconsumed = 4;
		}
		if (zip->entry->flags & LA_USED_ZIP64) {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le64dec(p + 4);
			zip->entry->uncompressed_size = archive_le64dec(p + 12);
			zip->unconsumed += 20;
		} else {
			zip->entry->crc32 = archive_le32dec(p);
			zip->entry->compressed_size = archive_le32dec(p + 4);
			zip->entry->uncompressed_size = archive_le32dec(p + 8);
			zip->unconsumed += 12;
		}
	}

	return (ARCHIVE_OK);
}